

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dof_demo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  options_description_easy_init *poVar2;
  typed_value<int,_char> *ptVar3;
  const_iterator cVar4;
  ostream *poVar5;
  const_iterator cVar6;
  variable_value *pvVar7;
  uint *puVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  shared_ptr<lf::mesh::Mesh> mesh_p;
  UniformFEDofHandler dof_handler;
  options_description desc;
  variables_map vm;
  uint local_2ac;
  allocator_type local_2a5;
  int local_2a4;
  int local_2a0;
  undefined4 uStack_29c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  undefined1 local_290 [184];
  shared_ptr<const_lf::mesh::Mesh> local_1d8;
  options_description local_1c8;
  function1<std::pair<std::string,_std::string>,_const_std::string_&> local_148;
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_120;
  variables_map local_f0;
  pair<const_lf::base::RefEl,_unsigned_int> local_50;
  undefined1 local_48;
  int local_44;
  undefined1 local_40;
  int local_3c;
  undefined1 local_38;
  int local_34;
  
  pcVar1 = local_290 + 0x10;
  local_290._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Allowed options","");
  boost::program_options::options_description::options_description
            (&local_1c8,(string *)local_290,0x50,0x28);
  if ((pointer)local_290._0_8_ != pcVar1) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  local_290._0_8_ = boost::program_options::options_description::add_options(&local_1c8);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_290,"help,h",
                      "--ndof_node <N> --ndof_edge <N> --ndof_tria <N> --ndof_quad <N>");
  ptVar3 = boost::program_options::value<int>((int *)0x0);
  local_f0.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)
       CONCAT44(local_f0.super_abstract_variables_map._vptr_abstract_variables_map._4_4_,1);
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,(int *)&local_f0);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     (poVar2,"ndof_node,n",(value_semantic *)ptVar3,"No of dofs on nodes");
  ptVar3 = boost::program_options::value<int>((int *)0x0);
  local_50.first.type_ = kSegment;
  local_50._1_3_ = 0;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,(int *)&local_50);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     (poVar2,"ndof_edge,e",(value_semantic *)ptVar3,"No of dofs on edges");
  ptVar3 = boost::program_options::value<int>((int *)0x0);
  local_2a0 = 1;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,&local_2a0);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     (poVar2,"ndof_tria,t",(value_semantic *)ptVar3,"No of dofs on triangles");
  ptVar3 = boost::program_options::value<int>((int *)0x0);
  local_2a4 = 4;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,&local_2a4);
  boost::program_options::options_description_easy_init::operator()
            (poVar2,"ndof_quad,q",(value_semantic *)ptVar3,"Mp of dofs on quadrilaterals");
  boost::program_options::variables_map::variables_map(&local_f0);
  local_148.super_function_base.vtable = (vtable_base *)0x0;
  local_148.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_148.super_function_base.functor._8_8_ = 0;
  local_148.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_290,argc,argv,&local_1c8,0,&local_148);
  boost::program_options::store((parsed_options *)local_290,&local_f0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_290);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_148);
  local_290._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"help","");
  this = &local_f0.
          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(&this->_M_t,(key_type *)local_290);
  if ((pointer)local_290._0_8_ != pcVar1) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node ==
      &local_f0.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    local_290._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_node","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_290);
    if ((pointer)local_290._0_8_ != pcVar1) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if (cVar6._M_node == cVar4._M_node) {
      local_2ac = 1;
    }
    else {
      local_290._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_node","");
      pvVar7 = boost::program_options::abstract_variables_map::operator[]
                         (&local_f0.super_abstract_variables_map,(string *)local_290);
      puVar8 = (uint *)boost::any_cast<int_const&>(&pvVar7->v);
      local_2ac = *puVar8;
      if ((pointer)local_290._0_8_ != pcVar1) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    local_290._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_edge","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_290);
    if ((pointer)local_290._0_8_ != pcVar1) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if (cVar6._M_node == cVar4._M_node) {
      iVar11 = 2;
    }
    else {
      local_290._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_edge","");
      pvVar7 = boost::program_options::abstract_variables_map::operator[]
                         (&local_f0.super_abstract_variables_map,(string *)local_290);
      piVar9 = boost::any_cast<int_const&>(&pvVar7->v);
      iVar11 = *piVar9;
      if ((pointer)local_290._0_8_ != pcVar1) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    local_290._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_tria","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_290);
    if ((pointer)local_290._0_8_ != pcVar1) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if (cVar6._M_node == cVar4._M_node) {
      iVar10 = 1;
    }
    else {
      local_290._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_tria","");
      pvVar7 = boost::program_options::abstract_variables_map::operator[]
                         (&local_f0.super_abstract_variables_map,(string *)local_290);
      piVar9 = boost::any_cast<int_const&>(&pvVar7->v);
      iVar10 = *piVar9;
      if ((pointer)local_290._0_8_ != pcVar1) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    local_290._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_quad","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_290);
    if ((pointer)local_290._0_8_ != pcVar1) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if (cVar6._M_node == cVar4._M_node) {
      iVar12 = 4;
    }
    else {
      local_290._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ndof_quad","");
      pvVar7 = boost::program_options::abstract_variables_map::operator[]
                         (&local_f0.super_abstract_variables_map,(string *)local_290);
      piVar9 = boost::any_cast<int_const&>(&pvVar7->v);
      iVar12 = *piVar9;
      if ((pointer)local_290._0_8_ != pcVar1) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"LehrFEM++ demo: assignment of global shape functions",0x34);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_290,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#dof/vertex = ",0xe);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_290,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#dof/edge = ",0xc);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_290,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#dof/triangle = ",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_290,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#dof/quadrilateral = ",0x15);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_290,1);
    lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_2a0,2,1.0);
    lf::mesh::utils::PrintInfo((ostream *)&std::cout,(Mesh *)CONCAT44(uStack_29c,local_2a0),0xb);
    local_1d8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(uStack_29c,local_2a0);
    local_1d8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_298;
    if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_298->_M_use_count = local_298->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_298->_M_use_count = local_298->_M_use_count + 1;
      }
    }
    local_50.first.type_ = kPoint;
    local_50.second = local_2ac;
    local_48 = 2;
    local_40 = 3;
    local_38 = 4;
    __l._M_len = 4;
    __l._M_array = &local_50;
    local_44 = iVar11;
    local_3c = iVar10;
    local_34 = iVar12;
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::map((map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
           *)&local_120,__l,(less<lf::base::RefEl> *)&local_2a4,&local_2a5);
    lf::assemble::UniformFEDofHandler::UniformFEDofHandler
              ((UniformFEDofHandler *)local_290,&local_1d8,(dof_map_t *)&local_120,true);
    std::
    _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::~_Rb_tree(&local_120);
    if (local_1d8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lf::assemble::PrintInfo((ostream *)&std::cout,(DofHandler *)local_290,0x1e);
    lf::assemble::UniformFEDofHandler::~UniformFEDofHandler((UniformFEDofHandler *)local_290);
    if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
    }
  }
  else {
    poVar5 = boost::program_options::operator<<((ostream *)&std::cout,&local_1c8);
    local_290[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_290,1);
  }
  local_f0.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_00235ab8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f0.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_f0.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&this->_M_t);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_1c8.groups);
  if (local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_caption._M_dataplus._M_p != &local_1c8.m_caption.field_2) {
    operator_delete(local_1c8.m_caption._M_dataplus._M_p,
                    local_1c8.m_caption.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  // The following code is modeled after the example from
  // https://theboostcpplibraries.com/boost.program_options
  // and defines allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  // clang-format off
  desc.add_options()
  ("help,h", "--ndof_node <N> --ndof_edge <N> --ndof_tria <N> --ndof_quad <N>")
  ("ndof_node,n", po::value<int>()->default_value(1), "No of dofs on nodes")
  ("ndof_edge,e", po::value<int>()->default_value(2), "No of dofs on edges")
  ("ndof_tria,t", po::value<int>()->default_value(1), "No of dofs on triangles")
  ("ndof_quad,q", po::value<int>()->default_value(4), "Mp of dofs on quadrilaterals");
  // clang-format on
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  if (vm.count("help") > 0) {
    std::cout << desc << '\n';
  } else {
    // Retrieve number of degrees of freedom for each entity type from command
    // line arguments
    lf::base::size_type ndof_node = 1;
    if (vm.count("ndof_node") > 0) {
      ndof_node = vm["ndof_node"].as<int>();
    }
    lf::base::size_type ndof_edge = 2;
    if (vm.count("ndof_edge") > 0) {
      ndof_edge = vm["ndof_edge"].as<int>();
    }
    lf::base::size_type ndof_tria = 1;
    if (vm.count("ndof_tria") > 0) {
      ndof_tria = vm["ndof_tria"].as<int>();
    }
    lf::base::size_type ndof_quad = 4;
    if (vm.count("ndof_quad") > 0) {
      ndof_quad = vm["ndof_quad"].as<int>();
    }
    std::cout << "LehrFEM++ demo: assignment of global shape functions" << '\n';
    std::cout << "#dof/vertex = " << ndof_node << '\n';
    std::cout << "#dof/edge = " << ndof_edge << '\n';
    std::cout << "#dof/triangle = " << ndof_tria << '\n';
    std::cout << "#dof/quadrilateral = " << ndof_quad << '\n';

    // Build a mesh comprising two cells
    const std::shared_ptr<lf::mesh::Mesh> mesh_p =
        lf::mesh::test_utils::GenerateHybrid2DTestMesh(2);
    // Output information about the mesh
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    // Create a dof handler object describing a uniform distribution
    // of shape functions
    const lf::assemble::UniformFEDofHandler dof_handler(
        mesh_p, {{lf::base::RefEl::kPoint(), ndof_node},
                 {lf::base::RefEl::kSegment(), ndof_edge},
                 {lf::base::RefEl::kTria(), ndof_tria},
                 {lf::base::RefEl::kQuad(), ndof_quad}});
    // Copious output of information about dof handler
    PrintInfo(std::cout, dof_handler, 30);
  }
  return 0L;
}